

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O0

void __thiscall
xmrig::ConfigTransform::transformUint64(ConfigTransform *this,Document *doc,int key,uint64_t arg)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RCX;
  int in_EDX;
  char *in_RSI;
  Document *in_RDI;
  BaseTransform *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  Document *doc_00;
  
  if (in_EDX == 0x74) {
    (in_RDI->stack_).allocator_ = (CrtAllocator *)in_RCX;
  }
  else if (in_EDX == 0x76) {
    doc_00 = in_RDI;
    pMVar1 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)xmrig::intensity((uint64_t)in_RCX);
    in_RDI->ownAllocator_ = pMVar1;
    isHwAes((uint64_t)in_RCX);
    BaseTransform::set<bool>
              (unaff_retaddr,doc_00,in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               SUB81((ulong)in_RCX >> 0x38,0));
  }
  else if (in_EDX == 0x3fc) {
    in_RDI->allocator_ = in_RCX;
  }
  else if (in_EDX == 0x3fd) {
    BaseTransform::set<unsigned_long>
              (unaff_retaddr,in_RDI,in_RSI,(char *)CONCAT44(0x3fd,in_stack_ffffffffffffffe8),
               (unsigned_long)in_RCX);
  }
  return;
}

Assistant:

void xmrig::ConfigTransform::transformUint64(rapidjson::Document &doc, int key, uint64_t arg)
{
    using namespace rapidjson;

    switch (key) {
    case IConfig::CPUAffinityKey: /* --cpu-affinity */
        m_affinity = static_cast<int64_t>(arg);
        break;

    case IConfig::ThreadsKey: /* --threads */
        m_threads = arg;
        break;

    case IConfig::AVKey: /* --av */
        m_intensity = intensity(arg);
        set(doc, kCpu, "hw-aes", isHwAes(arg));
        break;

    case IConfig::CPUPriorityKey: /* --cpu-priority */
        return set(doc, kCpu, "priority", arg);

    default:
        break;
    }
}